

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

Region * __thiscall
FlowGraph::PropagateRegionFromPred
          (FlowGraph *this,BasicBlock *block,BasicBlock *predBlock,Region *predRegion,
          Instr **tryInstr)

{
  OpCode OVar1;
  BasicBlock *pBVar2;
  LabelInstr *this_00;
  code *pcVar3;
  bool bVar4;
  Region *pRVar5;
  undefined4 *puVar6;
  Region *pRVar7;
  LabelInstr *pLVar8;
  Instr *pIVar9;
  BranchInstr *pBVar10;
  Func **ppFVar11;
  long lVar12;
  Func *func;
  uint lineNumber;
  Instr *pIVar13;
  
  pBVar2 = predBlock->next;
  ppFVar11 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar11 = &predBlock->func;
  }
  lVar12 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar12 = 0xd0;
  }
  pIVar9 = *(Instr **)((long)&(*ppFVar11)->m_alloc + lVar12);
  if (pIVar9 == (Instr *)0x0) {
    return predRegion;
  }
  this_00 = (LabelInstr *)block->firstInstr;
  OVar1 = pIVar9->m_opcode;
  switch(OVar1) {
  case TryCatch:
    pIVar13 = pIVar9->m_next;
    if ((pIVar13->m_kind != InstrKindLabel) && (pIVar13->m_kind != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x7e4,"(predLastInstr->m_next->IsLabelInstr())",
                         "predLastInstr->m_next->IsLabelInstr()");
      if (!bVar4) goto LAB_003fcd32;
      *puVar6 = 0;
      pIVar13 = pIVar9->m_next;
    }
    pLVar8 = IR::Instr::AsLabelInstr(pIVar13);
    pRVar7 = pLVar8->m_region;
    pBVar10 = IR::Instr::AsBranchInstr(pIVar9);
    func = this->func;
    if (this_00 != pBVar10->m_branchTarget) goto LAB_003fcb89;
    pRVar5 = Region::New(RegionTypeCatch,predRegion,func);
    if (pRVar7 != (Region *)0x0) {
LAB_003fc952:
      pRVar5->matchingTryRegion = pRVar7;
      pRVar7->matchingCatchRegion = pRVar5;
      return pRVar5;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x7eb,"(tryRegion)","tryRegion");
    if (bVar4) {
      *puVar6 = 0;
      goto LAB_003fc952;
    }
    goto LAB_003fcd32;
  case TryFinally:
    pIVar13 = pIVar9->m_next;
    if ((pIVar13->m_kind != InstrKindLabel) && (pIVar13->m_kind != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x7f9,"(predLastInstr->m_next->IsLabelInstr())",
                         "predLastInstr->m_next->IsLabelInstr()");
      if (!bVar4) goto LAB_003fcd32;
      *puVar6 = 0;
      pIVar13 = pIVar9->m_next;
    }
    pLVar8 = IR::Instr::AsLabelInstr(pIVar13);
    pRVar7 = pLVar8->m_region;
    pBVar10 = IR::Instr::AsBranchInstr(pIVar9);
    if (this_00 == pBVar10->m_branchTarget) {
      if ((pRVar7 == (Region *)0x0) || (pRVar7->type != RegionTypeTry)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x7ff,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar4) goto LAB_003fcd32;
        *puVar6 = 0;
      }
      pRVar5 = Region::New(RegionTypeFinally,predRegion,this->func);
      pRVar5->matchingTryRegion = pRVar7;
      pRVar7->matchingFinallyOnExceptRegion = pRVar5;
      *tryInstr = pIVar9;
      return pRVar5;
    }
    func = this->func;
LAB_003fcb89:
    pRVar7 = Region::New(RegionTypeTry,predRegion,func);
    *tryInstr = pIVar9;
    return pRVar7;
  case Catch:
    goto switchD_003fc856_caseD_e9;
  case LeaveNull:
    if (predRegion->parent != (Region *)0x0) {
      return predRegion->parent;
    }
    bVar4 = Func::IsLoopBodyInTry(this->func);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      lineNumber = 0x82a;
LAB_003fcc74:
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,lineNumber,"(this->func->IsLoopBodyInTry())",
                         "this->func->IsLoopBodyInTry()");
      if (!bVar4) {
LAB_003fcd32:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    break;
  case Leave:
    pIVar13 = (this_00->super_Instr).m_next;
    if ((pIVar13 != (Instr *)0x0) && (pIVar13->m_opcode == Finally)) {
      if (predRegion->matchingFinallyOnExceptRegion == (Region *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x810,"(tryRegion->GetMatchingFinallyRegion(true) != nullptr)",
                           "tryRegion->GetMatchingFinallyRegion(true) != nullptr");
        if (!bVar4) goto LAB_003fcd32;
        *puVar6 = 0;
      }
      pRVar7 = Region::New(RegionTypeFinally,predRegion->parent,this->func);
      if (predRegion->type != RegionTypeTry) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x812,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar4) goto LAB_003fcd32;
        *puVar6 = 0;
      }
      pRVar7->matchingTryRegion = predRegion;
      predRegion->matchingFinallyOnNoExceptRegion = pRVar7;
      return pRVar7;
    }
    if (predRegion->parent != (Region *)0x0) {
      return predRegion->parent;
    }
    bVar4 = Func::IsLoopBodyInTry(this->func);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      lineNumber = 0x81e;
      goto LAB_003fcc74;
    }
    break;
  default:
    if (OVar1 == BrOnException) {
      if ((predRegion->type != RegionTypeFinally) &&
         (pIVar9 = IR::Instr::GetNextRealInstr((Instr *)this_00), pIVar9->m_opcode == LeaveNull)) {
        return predRegion->parent;
      }
    }
    else if (OVar1 == BailOnException) {
      pIVar9 = (this_00->super_Instr).m_next;
      if ((pIVar9 == (Instr *)0x0) || (pIVar9->m_opcode != Finally)) {
        return (Region *)0x0;
      }
      pRVar7 = predRegion->matchingTryRegion;
      pRVar5 = Region::New(RegionTypeFinally,predRegion->parent,this->func);
      if ((pRVar7 == (Region *)0x0) || (pRVar7->type != RegionTypeTry)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x835,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar4) goto LAB_003fcd32;
        *puVar6 = 0;
      }
      pRVar5->matchingTryRegion = pRVar7;
      pRVar7->matchingFinallyOnNoExceptRegion = pRVar5;
      return pRVar5;
    }
    goto switchD_003fc856_caseD_e9;
  }
  pBVar10 = IR::Instr::AsBranchInstr(pIVar9);
  pBVar10->field_0x58 = pBVar10->field_0x58 | 4;
switchD_003fc856_caseD_e9:
  return predRegion;
}

Assistant:

Region *
FlowGraph::PropagateRegionFromPred(BasicBlock * block, BasicBlock * predBlock, Region * predRegion, IR::Instr * &tryInstr)
{
    // Propagate predRegion to region, looking at the flow transition for an opcode
    // that affects the region.
    Region * region = nullptr;
    IR::Instr * predLastInstr = predBlock->GetLastInstr();
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (predLastInstr == nullptr)
    {
        // Empty block: trivially propagate the region.
        region = predRegion;
    }
    else
    {
        Region * tryRegion = nullptr;
        IR::LabelInstr * tryInstrNext = nullptr;
        switch (predLastInstr->m_opcode)
        {
        case Js::OpCode::TryCatch:
            // Entry to a try-catch. See whether we're entering the try or the catch
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                region = Region::New(RegionTypeCatch, predRegion, this->func);
                Assert(tryRegion);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingCatchRegion(region);
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::TryFinally:
            // Entry to a try-finally. See whether we're entering the try or the finally
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region = Region::New(RegionTypeFinally, predRegion, this->func);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, true);
                tryInstr = predLastInstr;
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::Leave:
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion;
                Assert(tryRegion->GetMatchingFinallyRegion(true) != nullptr);
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
                break;
            }

            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::LeaveNull:
            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::BailOnException:
            // Infinite loop, no edge to non excepting finally
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion->GetMatchingTryRegion();
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
            }
            break;
        case Js::OpCode::BrOnException:
            // Infinite loop inside another EH region within finally,
            // We have added edges for all infinite loops inside a finally, identify that and transition to parent
            if (predRegion->GetType() != RegionTypeFinally && firstInstr->GetNextRealInstr()->m_opcode == Js::OpCode::LeaveNull)
            {
                region = predRegion->GetParent();
            }
            else
            {
                region = predRegion;
            }
            break;
        default:
            // Normal (non-EH) transition: just propagate the region.
            region = predRegion;
            break;
        }
    }
    return region;
}